

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O1

int Abc_NtkLevelReverse_rec(Abc_Obj_t *pNode)

{
  int iVar1;
  int iVar2;
  Abc_Ntk_t *pAVar3;
  Abc_Ntk_t *pAVar4;
  uint uVar5;
  int in_EDX;
  int Fill;
  Abc_Obj_t *pNode_00;
  long lVar6;
  
  uVar5 = *(uint *)&pNode->field_0x14 & 0xf;
  if (uVar5 == 6) {
    __assert_fail("!Abc_ObjIsNet(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcDfs.c"
                  ,0x56d,"int Abc_NtkLevelReverse_rec(Abc_Obj_t *)");
  }
  if (uVar5 - 5 < 0xfffffffe) {
    if ((uVar5 != 1) && (uVar5 != 7)) {
      __assert_fail("Abc_ObjIsNode( pNode ) || pNode->Type == ABC_OBJ_CONST1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcDfs.c"
                    ,0x571,"int Abc_NtkLevelReverse_rec(Abc_Obj_t *)");
    }
    pAVar3 = pNode->pNtk;
    iVar1 = pNode->Id;
    Vec_IntFillExtra(&pAVar3->vTravIds,iVar1 + 1,in_EDX);
    if (((long)iVar1 < 0) || ((pAVar3->vTravIds).nSize <= iVar1)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    pAVar4 = pNode->pNtk;
    iVar2 = pAVar4->nTravIds;
    if ((pAVar3->vTravIds).pArray[iVar1] != iVar2) {
      iVar1 = pNode->Id;
      Vec_IntFillExtra(&pAVar4->vTravIds,iVar1 + 1,Fill);
      if (((long)iVar1 < 0) || ((pAVar4->vTravIds).nSize <= iVar1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      (pAVar4->vTravIds).pArray[iVar1] = iVar2;
      *(uint *)&pNode->field_0x14 = *(uint *)&pNode->field_0x14 & 0xfff;
      if (0 < (pNode->vFanouts).nSize) {
        lVar6 = 0;
        do {
          pNode_00 = (Abc_Obj_t *)pNode->pNtk->vObjs->pArray[(pNode->vFanouts).pArray[lVar6]];
          if (pNode_00->pNtk->ntkType == ABC_NTK_NETLIST) {
            pNode_00 = (Abc_Obj_t *)pNode_00->pNtk->vObjs->pArray[*(pNode_00->vFanouts).pArray];
          }
          uVar5 = Abc_NtkLevelReverse_rec(pNode_00);
          if (*(uint *)&pNode->field_0x14 >> 0xc < uVar5) {
            *(uint *)&pNode->field_0x14 = *(uint *)&pNode->field_0x14 & 0xfff | uVar5 << 0xc;
          }
          lVar6 = lVar6 + 1;
        } while (lVar6 < (pNode->vFanouts).nSize);
      }
      iVar1 = (pNode->vFanins).nSize;
      if ((0 < iVar1) &&
         ((((pNode->pNtk->ntkFunc != ABC_FUNC_MAP || (iVar1 != 1)) ||
           ((*(uint *)&pNode->field_0x14 & 0xf) != 7)) || ((pNode->field_5).pData != (void *)0x0))))
      {
        *(int *)&pNode->field_0x14 = *(int *)&pNode->field_0x14 + 0x1000;
      }
    }
  }
  return *(uint *)&pNode->field_0x14 >> 0xc;
}

Assistant:

int Abc_NtkLevelReverse_rec( Abc_Obj_t * pNode )
{
    Abc_Obj_t * pNext;
    int i, Level;
    assert( !Abc_ObjIsNet(pNode) );
    // skip the PI
    if ( Abc_ObjIsCo(pNode) )
        return pNode->Level;
    assert( Abc_ObjIsNode( pNode ) || pNode->Type == ABC_OBJ_CONST1);
    // if this node is already visited, return
    if ( Abc_NodeIsTravIdCurrent( pNode ) )
        return pNode->Level;
    // mark the node as visited
    Abc_NodeSetTravIdCurrent( pNode );
    // visit the transitive fanin
    pNode->Level = 0;
    Abc_ObjForEachFanout( pNode, pNext, i )
    {
        Level = Abc_NtkLevelReverse_rec( Abc_ObjFanout0Ntk(pNext) );
        if ( pNode->Level < (unsigned)Level )
            pNode->Level = Level;
    }
    if ( Abc_ObjFaninNum(pNode) > 0 && !Abc_ObjIsBarBuf(pNode) )
        pNode->Level++;
    return pNode->Level;
}